

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O3

void __thiscall libtorrent::aux::merkle_tree::optimize_storage_piece_layer(merkle_tree *this)

{
  libtorrent *this_00;
  pointer pdVar1;
  digest32<256L> *pdVar2;
  pointer pdVar3;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var4;
  bool bVar5;
  int iVar6;
  difference_type extraout_RDX;
  long lVar7;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  __first;
  long lVar8;
  digest32<256L> *this_01;
  digest32<256L> *pdVar9;
  span<const_libtorrent::digest32<256L>_> tree;
  vector<sha256_hash> new_tree;
  allocator_type local_49;
  pointer local_48;
  pointer pdStack_40;
  pointer local_38;
  
  if (this->m_mode != full_tree) {
    return;
  }
  iVar6 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
                           (this->m_blocks_per_piece_log & 0x1f));
  if (this->m_blocks_per_piece_log == '\0') {
    return;
  }
  this_00 = (libtorrent *)
            (this->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = merkle_num_nodes(iVar6);
  tree.m_ptr = (digest32<256L> *)(long)iVar6;
  tree.m_len = extraout_RDX;
  bVar5 = merkle_validate_single_layer(this_00,tree);
  if (!bVar5) {
    return;
  }
  pdVar1 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = merkle_num_leafs(this->m_num_blocks);
  iVar6 = merkle_first_leaf(iVar6);
  this_01 = pdVar1 + iVar6;
  pdVar2 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pdVar2 - (long)this_01;
  if (0 < lVar8 >> 7) {
    lVar7 = (lVar8 >> 7) + 1;
    do {
      bVar5 = digest32<256L>::is_all_zeros(this_01);
      pdVar9 = this_01;
      if (!bVar5) goto LAB_00223c52;
      bVar5 = digest32<256L>::is_all_zeros(this_01 + 1);
      pdVar9 = this_01 + 1;
      if (!bVar5) goto LAB_00223c52;
      bVar5 = digest32<256L>::is_all_zeros(this_01 + 2);
      pdVar9 = this_01 + 2;
      if (!bVar5) goto LAB_00223c52;
      bVar5 = digest32<256L>::is_all_zeros(this_01 + 3);
      pdVar9 = this_01 + 3;
      if (!bVar5) goto LAB_00223c52;
      this_01 = this_01 + 4;
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + -0x80;
    } while (1 < lVar7);
  }
  lVar8 = lVar8 >> 5;
  if (lVar8 == 1) {
LAB_00223c41:
    bVar5 = digest32<256L>::is_all_zeros(this_01);
    pdVar9 = this_01;
    if (bVar5) {
      pdVar9 = pdVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_00223c31:
    bVar5 = digest32<256L>::is_all_zeros(this_01);
    pdVar9 = this_01;
    if (bVar5) {
      this_01 = this_01 + 1;
      goto LAB_00223c41;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_00223c5b;
    bVar5 = digest32<256L>::is_all_zeros(this_01);
    pdVar9 = this_01;
    if (bVar5) {
      this_01 = this_01 + 1;
      goto LAB_00223c31;
    }
  }
LAB_00223c52:
  if (pdVar9 != pdVar2) {
    return;
  }
LAB_00223c5b:
  iVar6 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
                           (this->m_blocks_per_piece_log & 0x1f));
  iVar6 = merkle_first_leaf(iVar6);
  __first._M_current =
       (this->m_tree).
       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
       _M_impl.super__Vector_impl_data._M_start + iVar6;
  ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
            ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
             &local_48,__first,
             __first._M_current +
             (this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
             (this->m_blocks_per_piece_log & 0x1f)),&local_49);
  pdVar1 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_tree).
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = local_48;
  (this->m_tree).
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pdStack_40;
  (this->m_tree).
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  pdStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar3 - (long)pdVar1);
  }
  this->m_mode = piece_layer;
  _Var4.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_block_verified).m_buf.
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  (this->m_block_verified).m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
  if (_Var4.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
    operator_delete__((void *)_Var4.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage_piece_layer()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		// if we have *any* blocks, we can't transition into piece layer mode,
		// since we would lose those hashes
		int const piece_layer_size = merkle_num_leafs(num_pieces());
		if (m_blocks_per_piece_log > 0
			&& merkle_validate_single_layer(span<sha256_hash const>(m_tree).subspan(0, merkle_num_nodes(piece_layer_size)))
			&& std::all_of(m_tree.begin() + block_layer_start(), m_tree.end(), [](sha256_hash const& h) { return h.is_all_zeros(); })
			)
		{
			int const start = piece_layer_start();
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + num_pieces());

			m_tree = std::move(new_tree);
			m_mode = mode_t::piece_layer;
			m_block_verified.clear();
			return;
		}
	}